

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scaleElement(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,int row,int col,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *val)

{
  int *piVar1;
  int in_ECX;
  long in_RDX;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int in_R8D;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar2;
  cpp_dec_float<200U,_int,_void> *this_00;
  int in_stack_ffffffffffffff1c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff20;
  
  this_00 = in_RDI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                    CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  piVar1 = DataArray<int>::operator[]((DataArray<int> *)(in_RDX + 0x178),in_R8D);
  iVar2 = *piVar1;
  DataArray<int>::operator[]((DataArray<int> *)(in_RDX + 0xb0),in_ECX);
  spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (this_00,(cpp_dec_float<200U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffe88));
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R SPxScaler<R>::scaleElement(const SPxLPBase<R>& lp, int row, int col, R val) const
{
   assert(lp.isScaled());
   assert(col < lp.nCols());
   assert(col >= 0);
   assert(row < lp.nRows());
   assert(row >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   return spxLdexp(val, colscaleExp[col] + rowscaleExp[row]);
}